

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reusable_node.h
# Opt level: O2

void reusable_node_advance(ReusableNode *self)

{
  uint32_t uVar1;
  StackEntry *pSVar2;
  SubtreeHeapData *pSVar3;
  Subtree SVar4;
  uint uVar5;
  uint32_t uVar6;
  ulong uVar7;
  uint uVar8;
  Length LVar9;
  
  uVar1 = (self->stack).size;
  if (uVar1 == 0) {
    uVar5 = 0x31;
  }
  else {
    uVar7 = (ulong)(uVar1 - 1);
    pSVar2 = (self->stack).contents;
    SVar4 = pSVar2[uVar7].tree;
    uVar1 = pSVar2[uVar7].byte_offset;
    LVar9 = ts_subtree_total_size(SVar4);
    if ((((ulong)SVar4.ptr & 1) == 0) && (((SVar4.ptr)->field_0x2c & 0x40) != 0)) {
      SVar4 = ts_subtree_last_external_token(SVar4);
      self->last_external_token = SVar4;
    }
    while( true ) {
      uVar6 = (uint32_t)uVar7;
      (self->stack).size = uVar6;
      if (uVar6 == 0) {
        return;
      }
      if (uVar6 == 0) break;
      pSVar3 = pSVar2[uVar6 - 1].tree.ptr;
      uVar5 = 0;
      if (((ulong)pSVar3 & 1) == 0) {
        uVar5 = pSVar3->child_count;
      }
      uVar8 = pSVar2[uVar7].child_index + 1;
      uVar7 = (ulong)(uVar6 - 1);
      if (uVar8 < uVar5) {
        array__grow((VoidArray *)self,0x10);
        pSVar2 = (self->stack).contents;
        uVar5 = (self->stack).size;
        (self->stack).size = uVar5 + 1;
        pSVar2[uVar5].tree = (pSVar3->field_17).field_0.children[uVar8];
        pSVar2[uVar5].child_index = uVar8;
        pSVar2[uVar5].byte_offset = uVar1 + LVar9.bytes;
        return;
      }
    }
    uVar5 = 0x3d;
  }
  __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                ,uVar5,"void reusable_node_advance(ReusableNode *)");
}

Assistant:

static inline void reusable_node_advance(ReusableNode *self) {
  StackEntry last_entry = *array_back(&self->stack);
  uint32_t byte_offset = last_entry.byte_offset + ts_subtree_total_bytes(last_entry.tree);
  if (ts_subtree_has_external_tokens(last_entry.tree)) {
    self->last_external_token = ts_subtree_last_external_token(last_entry.tree);
  }

  Subtree tree;
  uint32_t next_index;
  do {
    StackEntry popped_entry = array_pop(&self->stack);
    next_index = popped_entry.child_index + 1;
    if (self->stack.size == 0) return;
    tree = array_back(&self->stack)->tree;
  } while (ts_subtree_child_count(tree) <= next_index);

  array_push(&self->stack, ((StackEntry) {
    .tree = tree.ptr->children[next_index],
    .child_index = next_index,
    .byte_offset = byte_offset,
  }));
}